

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm-parse.cc
# Opt level: O1

uint compute_correct(map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *ref,map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *hyp,uint len)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  int iVar4;
  _Base_ptr p_Var5;
  uint uVar6;
  _Rb_tree_header *p_Var7;
  _Rb_tree_header *p_Var8;
  uint uVar9;
  
  if (len == 0) {
    uVar6 = 0;
  }
  else {
    p_Var1 = &(ref->_M_t)._M_impl.super__Rb_tree_header;
    p_Var2 = &(hyp->_M_t)._M_impl.super__Rb_tree_header;
    uVar9 = 0;
    uVar6 = 0;
    do {
      p_Var3 = (ref->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[(int)*(size_t *)(p_Var3 + 1) < (int)uVar9]) {
        if ((int)uVar9 <= (int)*(size_t *)(p_Var3 + 1)) {
          p_Var5 = p_Var3;
        }
      }
      p_Var8 = p_Var1;
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         (p_Var8 = (_Rb_tree_header *)p_Var5,
         (int)uVar9 < (int)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
        p_Var8 = p_Var1;
      }
      p_Var3 = (hyp->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var2->_M_header;
      for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[(int)*(size_t *)(p_Var3 + 1) < (int)uVar9]) {
        if ((int)uVar9 <= (int)*(size_t *)(p_Var3 + 1)) {
          p_Var5 = p_Var3;
        }
      }
      p_Var7 = p_Var2;
      if (((_Rb_tree_header *)p_Var5 != p_Var2) &&
         (p_Var7 = (_Rb_tree_header *)p_Var5,
         (int)uVar9 < (int)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
        p_Var7 = p_Var2;
      }
      if (p_Var8 == p_Var1) {
        __assert_fail("ri != ref.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/clab[P]stack-lstm-ner/ner-system/lstm-parse.cc"
                      ,0x293,
                      "unsigned int compute_correct(const map<int, string> &, const map<int, string> &, unsigned int)"
                     );
      }
      if (p_Var7 == p_Var2) {
        __assert_fail("hi != hyp.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/clab[P]stack-lstm-ner/ner-system/lstm-parse.cc"
                      ,0x294,
                      "unsigned int compute_correct(const map<int, string> &, const map<int, string> &, unsigned int)"
                     );
      }
      iVar4 = std::__cxx11::string::compare((string *)(p_Var8 + 1));
      uVar6 = uVar6 + (iVar4 == 0);
      uVar9 = uVar9 + 1;
    } while (uVar9 != len);
  }
  return uVar6;
}

Assistant:

unsigned compute_correct(const map<int,string>& ref, const map<int,string>& hyp, unsigned len) {
  unsigned res = 0;
  for (unsigned i = 0; i < len; ++i) {
    auto ri = ref.find(i);
    auto hi = hyp.find(i);
    assert(ri != ref.end());
    assert(hi != hyp.end());
    if (ri->second.compare(hi->second)==0) ++res;
  }
  return res;
}